

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

int __thiscall llvm::raw_fd_ostream::close(raw_fd_ostream *this,int __fd)

{
  bool bVar1;
  error_code eVar2;
  undefined1 local_20 [8];
  error_code EC;
  raw_fd_ostream *this_local;
  
  EC._M_cat = (error_category *)this;
  if ((this->ShouldClose & 1U) == 0) {
    __assert_fail("ShouldClose",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                  ,0x29b,"void llvm::raw_fd_ostream::close()");
  }
  this->ShouldClose = false;
  raw_ostream::flush((raw_ostream *)this);
  eVar2 = sys::Process::SafelyCloseFileDescriptor(this->FD);
  EC._0_8_ = eVar2._M_cat;
  local_20._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_20);
  if (bVar1) {
    eVar2._4_4_ = 0;
    eVar2._M_value = local_20._0_4_;
    eVar2._M_cat = (error_category *)EC._0_8_;
    error_detected(this,eVar2);
  }
  this->FD = -1;
  return (int)this;
}

Assistant:

void raw_fd_ostream::close() {
  assert(ShouldClose);
  ShouldClose = false;
  flush();
  if (auto EC = sys::Process::SafelyCloseFileDescriptor(FD))
    error_detected(EC);
  FD = -1;
}